

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  mbedtls_mpi_uint mVar4;
  long lVar5;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  mbedtls_mpi T2;
  mbedtls_mpi T1;
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  size_t k;
  size_t t;
  size_t n;
  size_t i;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *R_local;
  mbedtls_mpi *Q_local;
  
  iVar1 = mbedtls_mpi_cmp_int(B,0);
  if (iVar1 == 0) {
    return -0xc;
  }
  mbedtls_mpi_init((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Z.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T2.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_d0);
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    if (((Q == (mbedtls_mpi *)0x0) || (i._4_4_ = mbedtls_mpi_lset(Q,0), i._4_4_ == 0)) &&
       ((R == (mbedtls_mpi *)0x0 || (i._4_4_ = mbedtls_mpi_copy(R,A), i._4_4_ == 0)))) {
      return 0;
    }
  }
  else {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&Y.p,A);
    if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&Z.p,B), i._4_4_ == 0)) {
      Z.p._0_4_ = 1;
      Y.p._0_4_ = 1;
      i._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&T1.p,A->n + 2);
      if ((i._4_4_ == 0) &&
         (((i._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&T1.p,0), i._4_4_ == 0 &&
           (i._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&T2.p,2), i._4_4_ == 0)) &&
          (i._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)local_d0,3), i._4_4_ == 0)))) {
        sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&Z.p);
        if ((sVar2 & 0x3f) < 0x3f) {
          X.p = (mbedtls_mpi_uint *)(0x3f - (sVar2 & 0x3f));
          i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&Y.p,(size_t)X.p);
          if ((i._4_4_ != 0) ||
             (i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&Z.p,(size_t)X.p), i._4_4_ != 0))
          goto LAB_0011a70f;
        }
        else {
          X.p = (mbedtls_mpi_uint *)0x0;
        }
        n = X._0_8_ - 1;
        uVar3 = Y._0_8_ - 1;
        i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&Z.p,(n - uVar3) * 0x40);
        while (i._4_4_ == 0) {
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Z.p);
          if (iVar1 < 0) {
            i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&Z.p,(n - uVar3) * 0x40);
            if (i._4_4_ == 0) goto LAB_0011a2f4;
            break;
          }
          *(long *)(Z.n + (n - uVar3) * 8) = *(long *)(Z.n + (n - uVar3) * 8) + 1;
          i._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Z.p)
          ;
        }
      }
    }
  }
LAB_0011a70f:
  mbedtls_mpi_free((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Z.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T2.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_d0);
  return i._4_4_;
LAB_0011a2f4:
  if (n <= uVar3) goto LAB_0011a673;
  if (*(ulong *)(X.n + n * 8) < *(ulong *)(Y.n + uVar3 * 8)) {
    mVar4 = mbedtls_int_div_int(*(mbedtls_mpi_uint *)(X.n + n * 8),
                                *(mbedtls_mpi_uint *)(X.n + (n - 1) * 8),
                                *(mbedtls_mpi_uint *)(Y.n + uVar3 * 8),(mbedtls_mpi_uint *)0x0);
    *(mbedtls_mpi_uint *)(Z.n + ((n - uVar3) + -1) * 8) = mVar4;
  }
  else {
    *(undefined8 *)(Z.n + ((n - uVar3) + -1) * 8) = 0xffffffffffffffff;
  }
  lVar5 = (n - uVar3) + -1;
  *(long *)(Z.n + lVar5 * 8) = *(long *)(Z.n + lVar5 * 8) + 1;
  do {
    lVar5 = (n - uVar3) + -1;
    *(long *)(Z.n + lVar5 * 8) = *(long *)(Z.n + lVar5 * 8) + -1;
    i._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&T2.p,0);
    if (i._4_4_ != 0) goto LAB_0011a70f;
    if (uVar3 == 0) {
      local_d8 = 0;
    }
    else {
      local_d8 = *(undefined8 *)(Y.n + (Y._0_8_ + -2) * 8);
    }
    *(undefined8 *)T1.n = local_d8;
    *(undefined8 *)(T1.n + 8) = *(undefined8 *)(Y.n + uVar3 * 8);
    i._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,
                                  *(mbedtls_mpi_uint *)(Z.n + ((n - uVar3) + -1) * 8));
    if ((i._4_4_ != 0) || (i._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)local_d0,0), i._4_4_ != 0))
    goto LAB_0011a70f;
    if (n < 2) {
      local_e0 = 0;
    }
    else {
      local_e0 = *(undefined8 *)(X.n + (n - 2) * 8);
    }
    *(undefined8 *)T2.n = local_e0;
    if (n == 0) {
      local_e8 = 0;
    }
    else {
      local_e8 = *(undefined8 *)(X.n + (n - 1) * 8);
    }
    *(undefined8 *)(T2.n + 8) = local_e8;
    *(undefined8 *)(T2.n + 0x10) = *(undefined8 *)(X.n + n * 8);
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)local_d0);
  } while (0 < iVar1);
  i._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&Z.p,
                                *(mbedtls_mpi_uint *)(Z.n + ((n - uVar3) + -1) * 8));
  if (((i._4_4_ != 0) ||
      (i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&T2.p,((n - uVar3) + -1) * 0x40), i._4_4_ != 0))
     || (i._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&T2.p)
        , i._4_4_ != 0)) goto LAB_0011a70f;
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&Y.p,0);
  if (iVar1 < 0) {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&Z.p);
    if (((i._4_4_ != 0) ||
        (i._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&T2.p,((n - uVar3) + -1) * 0x40), i._4_4_ != 0
        )) || (i._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,
                                             (mbedtls_mpi *)&T2.p), i._4_4_ != 0))
    goto LAB_0011a70f;
    lVar5 = (n - uVar3) + -1;
    *(long *)(Z.n + lVar5 * 8) = *(long *)(Z.n + lVar5 * 8) + -1;
  }
  n = n - 1;
  goto LAB_0011a2f4;
LAB_0011a673:
  if (Q != (mbedtls_mpi *)0x0) {
    i._4_4_ = mbedtls_mpi_copy(Q,(mbedtls_mpi *)&T1.p);
    if (i._4_4_ != 0) goto LAB_0011a70f;
    Q->s = A->s * B->s;
  }
  if ((R != (mbedtls_mpi *)0x0) &&
     (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&Y.p,(size_t)X.p), i._4_4_ == 0)) {
    Y.p._0_4_ = A->s;
    i._4_4_ = mbedtls_mpi_copy(R,(mbedtls_mpi *)&Y.p);
    if ((i._4_4_ == 0) && (iVar1 = mbedtls_mpi_cmp_int(R,0), iVar1 == 0)) {
      R->s = 1;
    }
  }
  goto LAB_0011a70f;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T2, 3 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
            Z.p[i - t - 1] = mbedtls_int_div_int( X.p[i], X.p[i - 1],
                                                            Y.p[t], NULL);
        }

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T2, 0 ) );
            T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
            T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
            T2.p[2] = X.p[i];
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    return( ret );
}